

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkSpirVProgram.cpp
# Opt level: O3

TestLog * vk::operator<<(TestLog *log,SpirVAsmSource *source)

{
  pointer pcVar1;
  long *local_90 [2];
  long local_80 [2];
  bool local_70;
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  local_70 = true;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)local_68,local_48,local_40 + (long)local_48);
  tcu::TestLog::startShaderProgram(log,local_70,(char *)local_68[0]);
  pcVar1 = (source->source)._M_dataplus._M_p;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + (source->source)._M_string_length);
  tcu::TestLog::writeSpirVAssemblySource(log,(char *)local_90[0]);
  tcu::TestLog::endShaderProgram(log);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const SpirVAsmSource& source)
{
	log << tcu::TestLog::ShaderProgram(true , "")
		<< tcu::TestLog::SpirVAssemblySource(source.source)
		<< tcu::TestLog::EndShaderProgram;

	return log;
}